

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

int ON_SubDFacePtr::CompareFacePointer(ON_SubDFacePtr *lhs,ON_SubDFacePtr *rhs)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs != (ON_SubDFacePtr *)0x0) {
    if (rhs != (ON_SubDFacePtr *)0x0) {
      uVar2 = lhs->m_ptr & 0xfffffffffffffff8;
      uVar3 = rhs->m_ptr & 0xfffffffffffffff8;
      uVar1 = 0xffffffff;
      if (uVar3 <= uVar2) {
        uVar1 = (uint)(uVar3 < uVar2);
      }
      return uVar1;
    }
    return -1;
  }
  return 1;
}

Assistant:

int ON_SubDFacePtr::CompareFacePointer(
  const ON_SubDFacePtr* lhs,
  const ON_SubDFacePtr* rhs
)
{
  if (lhs == rhs)
    return 0;
  if ( nullptr == lhs )
    return 1;
  if ( nullptr == rhs )
    return -1;

  const ON__UINT_PTR lhs_ptr = (lhs->m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
  const ON__UINT_PTR rhs_ptr = (rhs->m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
  if (lhs_ptr < rhs_ptr)
    return -1;
  if (lhs_ptr > rhs_ptr)
    return 1;
  return 0;
}